

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCheck.c
# Opt level: O2

void Aig_ManCheckMarkA(Aig_Man_t *p)

{
  void *pvVar1;
  int i;
  
  i = 0;
  while( true ) {
    if (p->vObjs->nSize <= i) {
      return;
    }
    pvVar1 = Vec_PtrEntry(p->vObjs,i);
    if ((pvVar1 != (void *)0x0) && ((*(byte *)((long)pvVar1 + 0x18) & 0x10) != 0)) break;
    i = i + 1;
  }
  __assert_fail("pObj->fMarkA == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigCheck.c"
                ,0x89,"void Aig_ManCheckMarkA(Aig_Man_t *)");
}

Assistant:

void Aig_ManCheckMarkA( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    Aig_ManForEachObj( p, pObj, i )
        assert( pObj->fMarkA == 0 );
}